

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

bool __thiscall flatbuffers::rust::RustGenerator::GenerateOneFile(RustGenerator *this)

{
  CodeWriter *this_00;
  EnumDef *enum_def;
  Namespace *pNVar1;
  StructDef *pSVar2;
  bool bVar3;
  char *__s;
  Parser *pPVar4;
  pointer ppEVar5;
  pointer ppSVar6;
  pointer ppSVar7;
  StructDef *struct_def;
  Namespace **ns;
  pointer ppNVar8;
  string file_path;
  string final_code;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &this->code_;
  CodeWriter::Clear(this_00);
  __s = BaseGenerator::FlatBuffersGeneratedWarning();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,__s,&local_c9);
  std::operator+(&local_c8,"// ",&local_a8);
  std::operator+(&local_48,&local_c8,"\n\n");
  CodeWriter::operator+=(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"// @generated",(allocator<char> *)&local_c8);
  CodeWriter::operator+=(this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (this->cur_name_space_ == (Namespace *)0x0) {
    GenNamespaceImports(this,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"",(allocator<char> *)&local_c8);
    CodeWriter::operator+=(this_00,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    pPVar4 = (this->super_BaseGenerator).parser_;
    for (ppNVar8 = (pPVar4->namespaces_).
                   super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppNVar8 !=
        (pPVar4->namespaces_).
        super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppNVar8 = ppNVar8 + 1) {
      for (ppEVar5 = (pPVar4->enums_).vec.
                     super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppEVar5 !=
          (pPVar4->enums_).vec.
          super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppEVar5 = ppEVar5 + 1) {
        enum_def = *ppEVar5;
        pNVar1 = (enum_def->super_Definition).defined_namespace;
        if ((pNVar1 == *ppNVar8) && ((enum_def->super_Definition).generated == false)) {
          SetNameSpace(this,pNVar1);
          GenEnum(this,enum_def);
          pPVar4 = (this->super_BaseGenerator).parser_;
        }
      }
      for (ppSVar6 = (pPVar4->structs_).vec.
                     super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppSVar6 !=
          (pPVar4->structs_).vec.
          super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppSVar6 = ppSVar6 + 1) {
        pSVar2 = *ppSVar6;
        pNVar1 = (pSVar2->super_Definition).defined_namespace;
        if (((pNVar1 == *ppNVar8) && (pSVar2->fixed == true)) &&
           ((pSVar2->super_Definition).generated == false)) {
          SetNameSpace(this,pNVar1);
          GenStruct(this,pSVar2);
          pPVar4 = (this->super_BaseGenerator).parser_;
        }
      }
      for (ppSVar7 = (pPVar4->structs_).vec.
                     super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppSVar7 != ppSVar6;
          ppSVar7 = ppSVar7 + 1) {
        pSVar2 = *ppSVar7;
        pNVar1 = (pSVar2->super_Definition).defined_namespace;
        if (((pNVar1 == *ppNVar8) && (pSVar2->fixed == false)) &&
           ((pSVar2->super_Definition).generated == false)) {
          SetNameSpace(this,pNVar1);
          GenTable(this,pSVar2);
          pPVar4 = (this->super_BaseGenerator).parser_;
          if ((pPVar4->opts).generate_object_based_api == true) {
            GenTableObject(this,pSVar2);
            pPVar4 = (this->super_BaseGenerator).parser_;
          }
        }
        ppSVar6 = (pPVar4->structs_).vec.
                  super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      pSVar2 = pPVar4->root_struct_def_;
      if ((pSVar2 != (StructDef *)0x0) &&
         (pNVar1 = (pSVar2->super_Definition).defined_namespace, pNVar1 == *ppNVar8)) {
        SetNameSpace(this,pNVar1);
        GenRootTableFuncs(this,pSVar2);
        pPVar4 = (this->super_BaseGenerator).parser_;
      }
    }
    if (this->cur_name_space_ != (Namespace *)0x0) {
      SetNameSpace(this,(Namespace *)0x0);
      pPVar4 = (this->super_BaseGenerator).parser_;
    }
    BaseGenerator::GeneratedFileName
              (&local_c8,&this->super_BaseGenerator,(this->super_BaseGenerator).path_,
               (this->super_BaseGenerator).file_name_,&pPVar4->opts);
    std::__cxx11::stringbuf::str();
    bVar3 = SaveFile(local_c8._M_dataplus._M_p,&local_a8,false);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    return bVar3;
  }
  __assert_fail("!cur_name_space_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                ,0x1b4,"bool flatbuffers::rust::RustGenerator::GenerateOneFile()");
}

Assistant:

bool GenerateOneFile() {
    code_.Clear();
    code_ += "// " + std::string(FlatBuffersGeneratedWarning()) + "\n\n";
    code_ += "// @generated";

    assert(!cur_name_space_);

    // Generate imports for the global scope in case no namespace is used
    // in the schema file.
    GenNamespaceImports(0);
    code_ += "";

    // Generate all code in their namespaces, once, because Rust does not
    // permit re-opening modules.
    //
    // TODO(rw): Use a set data structure to reduce namespace evaluations from
    //           O(n**2) to O(n).
    for (auto ns_it = parser_.namespaces_.begin();
         ns_it != parser_.namespaces_.end(); ++ns_it) {
      const auto &ns = *ns_it;

      // Generate code for all the enum declarations.
      for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
           ++it) {
        const auto &enum_def = **it;
        if (enum_def.defined_namespace == ns && !enum_def.generated) {
          SetNameSpace(enum_def.defined_namespace);
          GenEnum(enum_def);
        }
      }

      // Generate code for all structs.
      for (auto it = parser_.structs_.vec.begin();
           it != parser_.structs_.vec.end(); ++it) {
        const auto &struct_def = **it;
        if (struct_def.defined_namespace == ns && struct_def.fixed &&
            !struct_def.generated) {
          SetNameSpace(struct_def.defined_namespace);
          GenStruct(struct_def);
        }
      }

      // Generate code for all tables.
      for (auto it = parser_.structs_.vec.begin();
           it != parser_.structs_.vec.end(); ++it) {
        const auto &struct_def = **it;
        if (struct_def.defined_namespace == ns && !struct_def.fixed &&
            !struct_def.generated) {
          SetNameSpace(struct_def.defined_namespace);
          GenTable(struct_def);
          if (parser_.opts.generate_object_based_api) {
            GenTableObject(struct_def);
          }
        }
      }

      // Generate global helper functions.
      if (parser_.root_struct_def_) {
        auto &struct_def = *parser_.root_struct_def_;
        if (struct_def.defined_namespace != ns) { continue; }
        SetNameSpace(struct_def.defined_namespace);
        GenRootTableFuncs(struct_def);
      }
    }
    if (cur_name_space_) SetNameSpace(nullptr);

    const auto file_path = GeneratedFileName(path_, file_name_, parser_.opts);
    const auto final_code = code_.ToString();
    return SaveFile(file_path.c_str(), final_code, false);
  }